

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

StorageClass __thiscall
spvtools::opt::ConvertToSampledImagePass::GetStorageClass
          (ConvertToSampledImagePass *this,Instruction *variable)

{
  uint32_t id;
  int iVar1;
  StorageClass SVar2;
  TypeManager *this_00;
  Type *pTVar3;
  undefined4 extraout_var;
  
  if (variable->opcode_ == OpVariable) {
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    id = Instruction::type_id(variable);
    pTVar3 = analysis::TypeManager::GetType(this_00,id);
    iVar1 = (*pTVar3->_vptr_Type[0x21])(pTVar3);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      SVar2 = Max;
    }
    else {
      SVar2 = *(StorageClass *)(CONCAT44(extraout_var,iVar1) + 0x30);
    }
    return SVar2;
  }
  __assert_fail("variable.opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                ,0x81,
                "spv::StorageClass spvtools::opt::ConvertToSampledImagePass::GetStorageClass(const Instruction &) const"
               );
}

Assistant:

spv::StorageClass ConvertToSampledImagePass::GetStorageClass(
    const Instruction& variable) const {
  assert(variable.opcode() == spv::Op::OpVariable);
  auto* type = context()->get_type_mgr()->GetType(variable.type_id());
  auto* pointer_type = type->AsPointer();
  if (!pointer_type) return spv::StorageClass::Max;

  return pointer_type->storage_class();
}